

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Transmitter_PDU::Transmitter_PDU(Transmitter_PDU *this,Header *H)

{
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,H);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_00215178;
  DATA_TYPE::RadioEntityType::RadioEntityType(&this->m_RadioEntityType);
  this->m_ui16Padding1 = 0;
  DATA_TYPE::AntennaLocation::AntennaLocation(&this->m_AntennaLocation);
  this->m_ui16AntennaPatternLength = 0;
  DATA_TYPE::ModulationType::ModulationType(&this->m_ModulationType);
  DATA_TYPE::CryptoSystem::CryptoSystem(&this->m_CryptoSystem);
  this->m_ui8LengthOfModulationParam = '\0';
  this->m_ui16Padding2 = 0;
  this->m_ui8Padding3 = '\0';
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Transmitter_PDU::Transmitter_PDU( const Header & H ) :
    Radio_Communications_Header( H ),
    m_ui16Padding1( 0 ),
    m_ui16AntennaPatternLength( 0 ),
    m_ui8LengthOfModulationParam( 0 ),
    m_ui16Padding2( 0 ),
    m_ui8Padding3( 0 )
{
}